

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpub.c
# Opt level: O0

int nn_xpub_create(void *hint,nn_sockbase **sockbase)

{
  nn_sockbase_vfptr *vfptr;
  nn_xpub *in_RSI;
  nn_xpub *self;
  
  vfptr = (nn_sockbase_vfptr *)nn_alloc_(0x13d898);
  if (vfptr == (nn_sockbase_vfptr *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/pubsub/xpub.c"
            ,0xa4);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_xpub_init(in_RSI,vfptr,(void *)0x13d907);
  (in_RSI->sockbase).vfptr = vfptr;
  return 0;
}

Assistant:

int nn_xpub_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xpub *self;

    self = nn_alloc (sizeof (struct nn_xpub), "socket (xpub)");
    alloc_assert (self);
    nn_xpub_init (self, &nn_xpub_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}